

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int big_file_create(BigFile *bf,char *basename)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  pcVar2 = _strdup(basename);
  bf->basename = pcVar2;
  iVar3 = 0;
  iVar1 = _big_file_mksubdir_r((char *)0x0,basename);
  if (iVar1 != 0) {
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0xc9);
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int big_file_create(BigFile * bf, const char * basename) {
    bf->basename = _strdup(basename);
    RAISEIF(0 != _big_file_mksubdir_r(NULL, basename),
        ex_subdir,
        NULL);
    return 0;
ex_subdir:
    return -1;
}